

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::_process_help_flags(App *this,bool trigger_help,bool trigger_all_help)

{
  Option *pOVar1;
  Option *pOVar2;
  pointer ppAVar3;
  CallForHelp *this_00;
  pointer_____offset_0x10___ *ppuVar4;
  const_iterator __begin2;
  pointer ppAVar5;
  
  pOVar1 = this->help_ptr_;
  pOVar2 = this->help_all_ptr_;
  if (pOVar1 != (Option *)0x0) {
    trigger_help = (pOVar1->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   (pOVar1->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start || trigger_help;
  }
  if (pOVar2 != (Option *)0x0) {
    trigger_all_help =
         (pOVar2->results_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         (pOVar2->results_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start || trigger_all_help;
  }
  ppAVar5 = (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar3 = (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar5 != ppAVar3) {
    do {
      _process_help_flags(*ppAVar5,trigger_help,trigger_all_help);
      ppAVar5 = ppAVar5 + 1;
    } while (ppAVar5 != ppAVar3);
    return;
  }
  if (trigger_all_help == false) {
    if (trigger_help == false) {
      return;
    }
    this_00 = (CallForHelp *)__cxa_allocate_exception(0x38);
    CallForHelp::CallForHelp(this_00);
    ppuVar4 = &CallForHelp::typeinfo;
  }
  else {
    this_00 = (CallForHelp *)__cxa_allocate_exception(0x38);
    CallForAllHelp::CallForAllHelp((CallForAllHelp *)this_00);
    ppuVar4 = &CallForAllHelp::typeinfo;
  }
  __cxa_throw(this_00,ppuVar4,Error::~Error);
}

Assistant:

CLI11_NODISCARD const Option *get_help_ptr() const { return help_ptr_; }